

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

int __thiscall
QDateTimeEditPrivate::nextPrevSection(QDateTimeEditPrivate *this,int current,bool forward)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = QWidget::isRightToLeft
                    (*(QWidget **)
                      &(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8);
  bVar1 = bVar1 != forward;
  if (current == -3) {
    if (!bVar1) {
      return *(int *)&this->field_0x418 + -1;
    }
  }
  else {
    if (current == -1) {
      return -2;
    }
    if (current == -2) {
      return (uint)bVar1 * 2 + -2;
    }
    iVar2 = (bVar1 - 1 | 1) + current;
    if ((long)iVar2 < *(long *)&this->field_0x418) {
      if (iVar2 < 0) {
        return -2;
      }
      return iVar2;
    }
  }
  return -3;
}

Assistant:

int QDateTimeEditPrivate::nextPrevSection(int current, bool forward) const
{
    Q_Q(const QDateTimeEdit);
    if (q->isRightToLeft())
        forward = !forward;

    switch (current) {
    case FirstSectionIndex: return forward ? 0 : FirstSectionIndex;
    case LastSectionIndex: return (forward ? LastSectionIndex : int(sectionNodes.size() - 1));
    case NoSectionIndex: return FirstSectionIndex;
    default: break;
    }
    Q_ASSERT(current >= 0 && current < sectionNodes.size());

    current += (forward ? 1 : -1);
    if (current >= sectionNodes.size()) {
        return LastSectionIndex;
    } else if (current < 0) {
        return FirstSectionIndex;
    }

    return current;
}